

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

double webfront::log::anon_unknown_3::log(double __x)

{
  string_view t;
  path *this;
  source_location *in_RCX;
  LogType in_DIL;
  double extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000003c8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_000003d0;
  char *in_stack_000003d8;
  string_view in_stack_000003e0;
  uint *in_stack_00000400;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000408;
  path *this_00;
  char *in_stack_fffffffffffffef8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  Sinks *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff28;
  format in_stack_ffffffffffffff47;
  char **in_stack_ffffffffffffff48;
  path *in_stack_ffffffffffffff50;
  
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  toChar(in_DIL);
  std::chrono::_V2::system_clock::now();
  this = (path *)http::std::source_location::file_name(in_RCX);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff47);
  http::std::filesystem::__cxx11::path::filename(in_stack_ffffffffffffff28);
  http::std::filesystem::__cxx11::path::string(this);
  http::std::source_location::line(in_RCX);
  this_00 = (path *)&stack0xfffffffffffffff0;
  std::
  format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string,unsigned_int,std::basic_string_view<char,std::char_traits<char>>&>
            (in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,
             in_stack_00000400,in_stack_00000408);
  std::__cxx11::string::operator_cast_to_basic_string_view(&this_00->_M_pathname);
  t._M_str = in_stack_ffffffffffffff20;
  t._M_len = (size_t)this;
  Sinks::operator()(in_stack_ffffffffffffff10,t);
  std::__cxx11::string::~string(&this_00->_M_pathname);
  std::__cxx11::string::~string(&this_00->_M_pathname);
  http::std::filesystem::__cxx11::path::~path(this_00);
  http::std::filesystem::__cxx11::path::~path(this_00);
  return extraout_XMM0_Qa;
}

Assistant:

inline static void log(LogType l, string_view text, const srcLoc& s) {
        out(format("[{}] {:%T} | {:16}:{:4} | {}", toChar(l), chrono::system_clock::now(), filesystem::path(s.file_name()).filename().string(), s.line(), text));
    }